

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
::call(cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
       *this,vector *args)

{
  size_type sVar1;
  runtime_error *this_00;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff08;
  sequence<0> *in_stack_ffffffffffffff10;
  proxy *this_01;
  any *in_stack_ffffffffffffff40;
  any *in_stack_ffffffffffffff48;
  
  this_01 = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+(&in_RDI->is_rvalue,(any *)this_00);
    std::operator+((any *)in_RDI,(char *)this_00);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    cs::runtime_error::runtime_error(this_00,in_stack_ffffffffffffff08);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  _call<0>((cni_helper<void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&),_void_(*)(const_std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_&)>
            *)this_01,(vector *)in_RDI,in_stack_ffffffffffffff10);
  any::any<cs::pointer>((any *)this_01,(pointer *)in_RDI);
  return (any)this_01;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result);
			return cs::null_pointer;
		}